

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x8f6cd8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x8f6dc8;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x8f6d00;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x8f6d28;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x8f6d50;
  this[-1].PredefinedType._M_dataplus._M_p = (pointer)0x8f6d78;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x8f6da0;
  puVar2 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70;
  puVar2 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  puVar3 = &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)puVar1,&PTR_construction_vtable_24__008f6de0);
  operator_delete(puVar1,0x1a8);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}